

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O3

float Abc_BufComputeDep(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pNode;
  int iVar3;
  uint uVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  
  if ((pObj->vFanouts).nSize < 1) {
    fVar8 = -1e+09;
  }
  else {
    pVVar6 = p->vOffsets;
    lVar7 = 0;
    fVar9 = -1e+09;
    do {
      pNode = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar7]];
      iVar1 = pNode->Id;
      lVar5 = (long)iVar1;
      if ((lVar5 < 0) || (pVVar6->nSize <= iVar1)) goto LAB_00455670;
      if (pVVar6->pArray[lVar5] == -1000000000) {
LAB_00455626:
        fVar8 = fVar9;
      }
      else {
        if (p->vDep->nSize <= iVar1) {
LAB_00455670:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = p->vDep->pArray[lVar5];
        iVar3 = Abc_NodeFindFanin(pNode,pObj);
        iVar2 = pNode->Id;
        if (((((long)iVar2 < 0) || (pVVar6 = p->vOffsets, pVVar6->nSize <= iVar2)) ||
            (uVar4 = iVar3 + pVVar6->pArray[iVar2], (int)uVar4 < 0)) ||
           (p->vEdges->nSize <= (int)uVar4)) goto LAB_00455670;
        fVar8 = (float)(iVar1 + p->vEdges->pArray[uVar4]);
        if (fVar8 <= fVar9) goto LAB_00455626;
      }
      lVar7 = lVar7 + 1;
      fVar9 = fVar8;
    } while (lVar7 < (pObj->vFanouts).nSize);
  }
  iVar1 = pObj->Id;
  if ((-1 < (long)iVar1) && (iVar1 < p->vDep->nSize)) {
    p->vDep->pArray[iVar1] = (int)fVar8;
    return fVar8;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

float Abc_BufComputeDep( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i;
    float DelayF, Delay = -ABC_INFINITY;
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        if ( Vec_IntEntry(p->vOffsets, Abc_ObjId(pFanout)) == -ABC_INFINITY )
            continue;
        DelayF = Abc_BufNodeDep(p, pFanout) + Abc_BufEdgeDelay(p, pFanout, Abc_NodeFindFanin(pFanout, pObj));
        if ( Delay < DelayF )
            Delay = DelayF;
    }
    Abc_BufSetNodeDep( p, pObj, Delay );
    return Delay;
}